

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

string * showReason_abi_cxx11_(string *__return_storage_ptr__,Reason r)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  stringstream ss;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  switch(r.field_0._0_4_ & 3) {
  case 0:
    if (r.field_0 != (Clause *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"clause",6);
      if (0xff < *(uint *)r.field_0) {
        uVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          if (*(uint *)r.field_0 >> 8 <= uVar3) {
            abort();
          }
          getLitString_abi_cxx11_(&local_200,*(uint *)((long)r.field_0 + 4 + uVar3 * 4) ^ 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)r.field_0 >> 8);
      }
      goto LAB_001bf527;
    }
    lVar2 = 9;
    pcVar4 = "no reason";
    break;
  case 1:
    lVar2 = 0x17;
    pcVar4 = "absorbed binary clause?";
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"single literal ",0xf);
    getLitString_abi_cxx11_(&local_200,(uint)((ulong)r.field_0 >> 2) & 0x3fffffff ^ 1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
    goto LAB_001bf4eb;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"two literals ",0xd);
    getLitString_abi_cxx11_(&local_200,(uint)((ulong)r.field_0 >> 2) & 0x3fffffff ^ 1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," & ",3);
    getLitString_abi_cxx11_(&local_1d8,r.field_0._4_4_ ^ 1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
LAB_001bf4eb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    goto LAB_001bf527;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar4,lVar2);
LAB_001bf527:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1e0;
}

Assistant:

std::string showReason(Reason r) {
	std::stringstream ss;
	switch (r.type()) {
		case 0:
			if (r.pt() == nullptr) {
				ss << "no reason";
			} else {
				Clause& c = *r.pt();
				ss << "clause";
				for (unsigned int i = 0; i < c.size(); i++) {
					ss << " " << getLitString(toInt(~c[i]));
				}
			}
			break;
		case 1:
			ss << "absorbed binary clause?";
			break;
		case 2:
			ss << "single literal " << getLitString(toInt(~toLit(r.d1())));
			break;
		case 3:
			ss << "two literals " << getLitString(toInt(~toLit((r.d1())))) << " & "
				 << getLitString(toInt(~toLit((r.d2()))));
			break;
		default:
			assert(false);
	}
	return ss.str();
}